

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContext.cpp
# Opt level: O2

ObjectReference __thiscall
PDFHummus::DocumentContext::GetReferenceFromState(DocumentContext *this,PDFDictionary *inDictionary)

{
  PDFObject *pPVar1;
  PDFInteger *this_00;
  unsigned_long uVar2;
  ObjectReference OVar3;
  PDFObjectCastPtr<PDFInteger> generationNumber;
  PDFObjectCastPtr<PDFInteger> objectID;
  allocator<char> local_79;
  RefCountPtr<PDFInteger> local_78;
  RefCountPtr<PDFInteger> local_68;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"ObjectID",(allocator<char> *)&local_78);
  pPVar1 = PDFDictionary::QueryDirectObject(inDictionary,&local_38);
  local_68.mValue = PDFObjectCast<PDFInteger>(pPVar1);
  local_68._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036f160;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"GenerationNumber",&local_79);
  pPVar1 = PDFDictionary::QueryDirectObject(inDictionary,&local_58);
  this_00 = PDFObjectCast<PDFInteger>(pPVar1);
  local_78._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036f160;
  local_78.mValue = this_00;
  std::__cxx11::string::~string((string *)&local_58);
  OVar3.ObjectID = PDFInteger::GetValue(local_68.mValue);
  uVar2 = PDFInteger::GetValue(this_00);
  RefCountPtr<PDFInteger>::~RefCountPtr(&local_78);
  RefCountPtr<PDFInteger>::~RefCountPtr(&local_68);
  OVar3.GenerationNumber = uVar2;
  return OVar3;
}

Assistant:

ObjectReference DocumentContext::GetReferenceFromState(PDFDictionary* inDictionary)
{
    PDFObjectCastPtr<PDFInteger> objectID(inDictionary->QueryDirectObject("ObjectID"));
    PDFObjectCastPtr<PDFInteger> generationNumber(inDictionary->QueryDirectObject("GenerationNumber"));

    return ObjectReference((ObjectIDType)(objectID->GetValue()),(unsigned long)generationNumber->GetValue());
}